

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  U32 UVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  uint uVar5;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,litLength);
  UVar2 = 0x800;
  if (((int)plVar4[0xc] != 2) && (UVar2 = 0x600, (int)plVar4[10] != 1)) {
    uVar5 = *(int *)(*plVar4 + (ulong)*literals * 4) + 1;
    if ((int)optPtr == 0) {
      if (uVar5 == 0) goto LAB_0016f70f;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = iVar3 << 8;
    }
    else {
      if (uVar5 == 0) goto LAB_0016f70f;
      uVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (0x16 < uVar1) goto LAB_0016f72e;
      uVar5 = (uVar5 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
    }
    if (*(uint *)(plVar4 + 8) < uVar5) {
      __assert_fail("WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x467d,
                    "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                   );
    }
    uVar5 = *(int *)(*plVar4 + (ulong)*literals * 4) + 1;
    if ((int)optPtr == 0) {
      if (uVar5 == 0) goto LAB_0016f70f;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      iVar3 = iVar3 << 8;
    }
    else {
      if (uVar5 == 0) {
LAB_0016f70f:
        __assert_fail("val != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x12c2,"U32 ZSTD_highbit32(U32)");
      }
      uVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (0x16 < uVar1) {
LAB_0016f72e:
        __assert_fail("hb + BITCOST_ACCURACY < 31",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x45cb,"U32 ZSTD_fracWeight(U32)");
      }
      iVar3 = (uVar5 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
    }
    UVar2 = *(uint *)(plVar4 + 8) - iVar3;
  }
  return UVar2;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = litLength * optPtr->litSumBasePrice;
        U32 u;
        for (u=0; u < litLength; u++) {
            assert(WEIGHT(optPtr->litFreq[literals[u]], optLevel) <= optPtr->litSumBasePrice);   /* literal cost should never be negative */
            price -= WEIGHT(optPtr->litFreq[literals[u]], optLevel);
        }
        return price;
    }
}